

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

int gray_move_to(FT_Vector *to,gray_PWorker worker)

{
  long lVar1;
  long lVar2;
  TPos y;
  TPos x;
  gray_PWorker worker_local;
  FT_Vector *to_local;
  
  lVar1 = to->x << 2;
  lVar2 = to->y << 2;
  gray_set_cell(worker,(TCoord)((ulong)lVar1 >> 8),(TCoord)((ulong)lVar2 >> 8));
  worker->x = lVar1;
  worker->y = lVar2;
  return 0;
}

Assistant:

static int
  gray_move_to( const FT_Vector*  to,
                gray_PWorker      worker )
  {
    TPos  x, y;


    /* start to a new position */
    x = UPSCALE( to->x );
    y = UPSCALE( to->y );

    gray_set_cell( RAS_VAR_ TRUNC( x ), TRUNC( y ) );

    ras.x = x;
    ras.y = y;
    return 0;
  }